

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtins.c
# Opt level: O3

int do_mknod(int nargs,char **args)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  __mode_t __mask;
  int *piVar5;
  byte *pbVar6;
  byte bVar7;
  uint uVar8;
  int iVar9;
  
  pbVar6 = (byte *)args[1];
  bVar7 = *pbVar6;
  if (bVar7 == 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = 0;
    do {
      pbVar6 = pbVar6 + 1;
      if ((bVar7 & 0xf8) != 0x30) {
        uVar2 = 0xffffffff;
        break;
      }
      uVar2 = (uint)(byte)(bVar7 - 0x30) + uVar2 * 8;
      bVar7 = *pbVar6;
    } while (bVar7 != 0);
  }
  cVar1 = *args[3];
  uVar8 = 0x2000;
  if ((cVar1 != 'u') && (cVar1 != 'c')) {
    if (cVar1 != 'b') {
      return -1;
    }
    uVar8 = 0x6000;
  }
  iVar3 = atoi(args[4]);
  uVar4 = atoi(args[5]);
  iVar9 = 0;
  __mask = umask(0);
  iVar3 = mknod(args[2],uVar8 | uVar2,(long)(int)(uVar4 | iVar3 << 8));
  if (iVar3 == 0) {
    umask(__mask);
  }
  else {
    piVar5 = __errno_location();
    iVar9 = -*piVar5;
  }
  return iVar9;
}

Assistant:

int do_mknod(int nargs, char **args) {
    mode_t mode, perm, mask;
    dev_t dev;

    perm = get_mode(args[1]);
    switch (args[3][0]) {
        case 'c':
        case 'u':
            mode = S_IFCHR;
            break;
        case 'b':
            mode = S_IFBLK;
            break;
        default:
            return -1;
    }

    if (mode == S_IFCHR || mode == S_IFBLK)
        dev = (atoi(args[4]) << 8) | atoi(args[5]);

    mode |= perm;
    mask = umask(0);
    if (mknod(args[2], mode, dev) != 0)
        return -errno;
    umask(mask);

    return 0;
}